

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargeLangevin::applyConstraints(FluctuatingChargeLangevin *this)

{
  Atom *pAVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  long lVar4;
  Molecule *pMVar5;
  long lVar6;
  int iVar7;
  pointer ppAVar8;
  result_type_conflict1 rVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  MoleculeIterator i;
  MoleculeIterator local_38;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_38._M_node = (_Base_ptr)0x0;
    pMVar5 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_38);
    if (pMVar5 != (Molecule *)0x0) {
      do {
        for (ppAVar8 = (pMVar5->fluctuatingCharges_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            (ppAVar8 !=
             (pMVar5->fluctuatingCharges_).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_finish && (pAVar1 = *ppAVar8, pAVar1 != (Atom *)0x0));
            ppAVar8 = ppAVar8 + 1) {
          rVar9 = std::normal_distribution<double>::operator()
                            (&this->forceDistribution_,
                             (this->randNumGen_).
                             super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&(this->forceDistribution_)._M_param);
          DVar2 = (pAVar1->super_StuntDouble).storage_;
          pSVar3 = ((pAVar1->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar6 = (long)(pAVar1->super_StuntDouble).localIndex_;
          lVar4 = *(long *)((long)&(pSVar3->atomData).flucQFrc.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + DVar2);
          dVar10 = rVar9 + *(double *)(lVar4 + lVar6 * 8);
          *(double *)(lVar4 + lVar6 * 8) = dVar10;
          iVar7 = *(int *)&(this->super_FluctuatingChargePropagator).field_0x2c;
          if (iVar7 < 1) {
            dVar12 = 0.0;
          }
          else {
            dVar11 = 0.0;
            dVar13 = dVar10;
            do {
              dVar12 = ((dVar13 * this->dt2_) / pAVar1->chargeMass_ +
                       *(double *)
                        (*(long *)((long)&(pSVar3->atomData).flucQVel.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar2) +
                        lVar6 * 8)) * -this->drag_;
              if (ABS(dVar12 - dVar11) <= this->forceTolerance_) break;
              dVar13 = dVar10 + dVar12;
              iVar7 = iVar7 + -1;
              dVar11 = dVar12;
            } while (iVar7 != 0);
          }
          *(double *)(lVar4 + lVar6 * 8) = dVar10 + dVar12;
        }
        pMVar5 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_38);
      } while (pMVar5 != (Molecule *)0x0);
    }
    FluctuatingChargeConstraints::applyConstraints
              ((this->super_FluctuatingChargePropagator).fqConstraints_);
  }
  return;
}

Assistant:

void FluctuatingChargeLangevin::applyConstraints() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cfrc, cmass, randomForce, frictionForce;
    RealType velStep, oldFF;  // used to test for convergence

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        randomForce = forceDistribution_(*randNumGen_);
        atom->addFlucQFrc(randomForce);

        // What remains contains velocity explicitly, but the velocity
        // required is at the full step: v(t + h), while we have
        // initially the velocity at the half step: v(t + h/2).  We
        // need to iterate to converge the friction force vector.

        // this is the velocity at the half-step:

        cvel = atom->getFlucQVel();

        // estimate velocity at full-step using everything but
        // friction forces:

        cfrc    = atom->getFlucQFrc();
        cmass   = atom->getChargeMass();
        velStep = cvel + dt2_ * cfrc / cmass;

        frictionForce = 0.0;

        // iteration starts here:

        for (int k = 0; k < maxIterNum_; k++) {
          oldFF         = frictionForce;
          frictionForce = -drag_ * velStep;
          // re-estimate velocities at full-step using friction forces:

          velStep = cvel + dt2_ * (cfrc + frictionForce) / cmass;

          // check for convergence

          if (fabs(frictionForce - oldFF) <= forceTolerance_)
            break;  // iteration ends here
        }
        atom->addFlucQFrc(frictionForce);
      }
    }
    fqConstraints_->applyConstraints();
  }